

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O3

void __thiscall
xs::TestDriver::startProcess
          (TestDriver *this,char *name,char *params,char *workingDir,char *caseList)

{
  (*this->m_process->_vptr_TestProcess[2])();
  this->m_state = STATE_PROCESS_STARTED;
  return;
}

Assistant:

void TestDriver::startProcess (const char* name, const char* params, const char* workingDir, const char* caseList)
{
	try
	{
		m_process->start(name, params, workingDir, caseList);
		m_state = STATE_PROCESS_STARTED;
	}
	catch (const TestProcessException& e)
	{
		printf("Failed to launch test process: %s\n", e.what());
		m_state				= STATE_PROCESS_LAUNCH_FAILED;
		m_lastLaunchFailure	= e.what();
	}
}